

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::ReadLinetypeSegment(ON_BinaryArchive *this,ON_LinetypeSegment *seg)

{
  uint uVar1;
  eSegType eVar2;
  ON__UINT32 local_20;
  byte local_19;
  uint i;
  bool rc;
  ON_LinetypeSegment *seg_local;
  ON_BinaryArchive *this_local;
  
  seg->m_length = ON_LinetypeSegment::OneMillimeterLine.m_length;
  uVar1 = ON_LinetypeSegment::OneMillimeterLine.m_reserved2;
  seg->m_seg_type = ON_LinetypeSegment::OneMillimeterLine.m_seg_type;
  seg->m_reserved2 = uVar1;
  _i = seg;
  seg_local = (ON_LinetypeSegment *)this;
  local_19 = ReadDouble(this,&seg->m_length);
  if ((bool)local_19) {
    local_20 = 0;
    local_19 = ReadInt(this,&local_20);
    if (local_20 == 0xffffffff) {
      local_20 = 0;
    }
    else if (local_20 == 0) {
      local_20 = 1;
    }
    else if (local_20 == 1) {
      local_20 = 2;
    }
    eVar2 = ON_LinetypeSegment::SegmentTypeFromUnsigned(local_20);
    _i->m_seg_type = eVar2;
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool ON_BinaryArchive::ReadLinetypeSegment(ON_LinetypeSegment& seg)
{
  seg = ON_LinetypeSegment::OneMillimeterLine;
  bool rc = ReadDouble(&seg.m_length);
  if (rc)
  {
    // ON_LinetypeSegment::eSegType::Unset was not added initialy, so juggling values is required for
    // Unset, stLine and stSpace.  Any future values with work without
    // juggling.
    unsigned int i = 0;
    rc = ReadInt(&i);
    switch (i)
    {
    case 0:
      i = static_cast<unsigned int>(ON_LinetypeSegment::eSegType::stLine);
      break;
    case 1:
      i = static_cast<unsigned int>(ON_LinetypeSegment::eSegType::stSpace);
      break;
    case ON_UNSET_UINT_INDEX:
      i = static_cast<unsigned int>(ON_LinetypeSegment::eSegType::Unset);
      break;
    }
    seg.m_seg_type = ON_LinetypeSegment::SegmentTypeFromUnsigned(i);
  }
  return rc;
}